

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O1

void __thiscall Fl_Function_Type::write_code1(Fl_Function_Type *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  Fl_Type *l;
  Fl_Function_Type *pFVar8;
  char *pcVar9;
  char cVar10;
  char *pcVar11;
  bool bVar12;
  char s [1024];
  char local_438 [1032];
  
  this->constructor = '\0';
  this->havewidgets = '\0';
  l = (this->super_Fl_Type).next;
  if (l == (Fl_Type *)0x0) {
    bVar2 = true;
  }
  else {
    iVar3 = (this->super_Fl_Type).level;
    bVar2 = l->level <= iVar3;
    if (iVar3 < l->level) {
      while (iVar3 = (*l->_vptr_Fl_Type[0x17])(), iVar3 == 0) {
        l = l->next;
        if ((l == (Fl_Type *)0x0) || (l->level <= (this->super_Fl_Type).level)) goto LAB_0017903c;
      }
      this->havewidgets = '\x01';
      bVar2 = false;
    }
  }
LAB_0017903c:
  if (!bVar2) {
    write_c("\n");
  }
  if ((this->super_Fl_Type).name_ == (char *)0x0) {
    if (!bVar2) {
      write_c("int main(int argc, char **argv) {\n");
    }
    goto LAB_001796e8;
  }
  pcVar11 = this->return_type;
  if (pcVar11 == (char *)0x0) {
    bVar1 = true;
    pcVar4 = (char *)0x0;
    bVar12 = false;
  }
  else {
    iVar3 = strcmp(pcVar11,"static");
    if (iVar3 == 0) {
      bVar12 = true;
      pcVar4 = (char *)0x0;
    }
    else {
      iVar3 = strncmp(pcVar11,"static ",7);
      bVar12 = iVar3 == 0;
      pcVar4 = pcVar11 + 7;
      if (!bVar12) {
        pcVar4 = pcVar11;
      }
    }
    iVar3 = strcmp(pcVar4,"virtual");
    if (iVar3 == 0) {
      pcVar4 = (char *)0x0;
      bVar1 = false;
    }
    else {
      iVar3 = strncmp(pcVar4,"virtual ",8);
      bVar1 = iVar3 != 0;
      pcVar4 = pcVar4 + (ulong)(iVar3 == 0) * 8;
    }
  }
  pcVar11 = "";
  pFVar8 = this;
  if (pcVar4 == (char *)0x0) {
    if (this->havewidgets == '\0') {
      pcVar4 = "void";
    }
    else {
      pcVar4 = subclassname(l);
      pcVar11 = "*";
    }
  }
  do {
    pFVar8 = (Fl_Function_Type *)(pFVar8->super_Fl_Type).parent;
    if (pFVar8 == (Fl_Function_Type *)0x0) {
      pcVar9 = (char *)0x0;
      goto LAB_00179180;
    }
    iVar3 = (*(pFVar8->super_Fl_Type)._vptr_Fl_Type[0x26])();
  } while (iVar3 == 0);
  pcVar9 = (pFVar8->super_Fl_Type).name_;
LAB_00179180:
  if (pcVar9 == (char *)0x0) {
    if (!bVar2) {
      Fl_Type::write_comment_c(&this->super_Fl_Type,"");
    }
    if (this->public_ == '\0') {
      if (!bVar2) {
        write_c("static ");
      }
    }
    else {
      if (this->cdecl_ == '\0') {
        pcVar9 = "%s%s %s;\n";
      }
      else {
        pcVar9 = "extern \"C\" { %s%s %s; }\n";
      }
      write_h(pcVar9,pcVar4,pcVar11,(this->super_Fl_Type).name_);
    }
    pcVar9 = (this->super_Fl_Type).name_;
    cVar10 = *pcVar9;
    if (cVar10 == '\0') {
      pcVar6 = local_438;
    }
    else {
      iVar3 = 0;
      pcVar6 = local_438;
      iVar5 = 0;
      bVar12 = false;
      bVar1 = false;
      lVar7 = 0;
      do {
        if ((bVar1) || (cVar10 != '(')) {
          if (!bVar1) {
            iVar3 = iVar3 - (uint)(cVar10 == ')');
          }
        }
        else {
          iVar3 = iVar3 + 1;
        }
        if ((cVar10 == '\"') && ((iVar5 == 0 || (pcVar9[-1] != '\\')))) {
          bVar1 = !bVar1;
        }
        else if (bVar1) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
          if ((cVar10 == '\'') && ((iVar5 == 0 || (pcVar9[-1] != '\\')))) {
            bVar12 = !bVar12;
          }
        }
        if ((((!bVar1) && (!bVar12)) && (iVar3 == 1)) &&
           ((iVar3 = 1, cVar10 == '=' && ((iVar5 == 0 || (pcVar9[-1] != '\'')))))) {
          cVar10 = pcVar9[1];
          pcVar9 = pcVar9 + 1;
          if (cVar10 != '\0') {
            iVar3 = 1;
            do {
              if (((!(bool)(bVar1 | bVar12)) && ((cVar10 == ',' || (cVar10 == ')')))) &&
                 (iVar3 == 1)) {
                bVar1 = false;
                iVar3 = 1;
                bVar12 = false;
                break;
              }
              if ((cVar10 == '\"') && (pcVar9[-1] != '\\')) {
                bVar1 = !bVar1;
              }
              else if (bVar1) {
                bVar1 = true;
              }
              else {
                bVar1 = false;
                if ((cVar10 == '\'') && (pcVar9[-1] != '\\')) {
                  bVar12 = !bVar12;
                  bVar1 = false;
                }
              }
              if (((cVar10 != '(') || (bVar1)) || (bVar12)) {
                if (!bVar1) {
                  iVar3 = iVar3 - (uint)(cVar10 == ')');
                }
              }
              else {
                iVar3 = iVar3 + 1;
              }
              cVar10 = pcVar9[1];
              pcVar9 = pcVar9 + 1;
            } while (cVar10 != '\0');
          }
        }
        if (lVar7 < 0x3ff) {
          lVar7 = lVar7 + 1;
          *pcVar6 = *pcVar9;
        }
        iVar5 = iVar5 + 1;
        pcVar6 = local_438 + lVar7;
        cVar10 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      } while (cVar10 != '\0');
    }
    *pcVar6 = '\0';
    if (!bVar2) {
      write_c("%s%s %s {\n",pcVar4,pcVar11,local_438);
    }
    goto LAB_001796e8;
  }
  if (!bVar2) {
    Fl_Type::write_comment_c(&this->super_Fl_Type,"");
  }
  write_public((int)this->public_);
  pcVar6 = (this->super_Fl_Type).name_;
  if (*pcVar6 != '~') {
    __n = strlen(pcVar9);
    iVar3 = strncmp(pcVar6,pcVar9,__n);
    if ((iVar3 != 0) || (pcVar6[__n] != '(')) goto LAB_00179239;
  }
  this->constructor = '\x01';
LAB_00179239:
  write_h("  ");
  if (bVar12) {
    write_h("static ");
  }
  if (!bVar1) {
    write_h("virtual ");
  }
  if ((this->constructor == '\0') && (write_h("%s%s ",pcVar4,pcVar11), !bVar2)) {
    write_c("%s%s ",pcVar4,pcVar11);
  }
  pcVar4 = (this->super_Fl_Type).name_;
  pcVar11 = local_438;
  do {
    if (*pcVar4 == ':') {
      if (pcVar4[1] != ':') break;
      pcVar4 = pcVar4 + 1;
      *pcVar11 = ':';
      pcVar11 = pcVar11 + 1;
    }
    else if (*pcVar4 == '\0') break;
    cVar10 = *pcVar4;
    pcVar4 = pcVar4 + 1;
    *pcVar11 = cVar10;
    pcVar11 = pcVar11 + 1;
  } while( true );
  *pcVar11 = '\0';
  iVar3 = 0;
  pcVar11 = local_438;
  write_h("%s;\n");
  pcVar4 = (this->super_Fl_Type).name_;
  cVar10 = *pcVar4;
  if (cVar10 != '\0') {
    pcVar11 = local_438;
    iVar5 = 0;
    bVar12 = false;
    bVar1 = false;
    lVar7 = 0;
    do {
      if ((bVar1) || (cVar10 != '(')) {
        if (!bVar1) {
          iVar3 = iVar3 - (uint)(cVar10 == ')');
        }
      }
      else {
        iVar3 = iVar3 + 1;
      }
      if ((cVar10 == '\"') && ((iVar5 == 0 || (pcVar4[-1] != '\\')))) {
        bVar1 = !bVar1;
      }
      else if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
        if ((cVar10 == '\'') && ((iVar5 == 0 || (pcVar4[-1] != '\\')))) {
          bVar12 = !bVar12;
        }
      }
      if (((((!bVar1) && (!bVar12)) && (iVar3 == 1)) && (iVar3 = 1, cVar10 == '=')) &&
         ((iVar5 == 0 || (pcVar4[-1] != '\'')))) {
        cVar10 = pcVar4[1];
        pcVar4 = pcVar4 + 1;
        if (cVar10 != '\0') {
          iVar3 = 1;
          do {
            if (((!(bool)(bVar1 | bVar12)) && ((cVar10 == ',' || (cVar10 == ')')))) && (iVar3 == 1))
            {
              bVar1 = false;
              iVar3 = 1;
              bVar12 = false;
              break;
            }
            if ((cVar10 == '\"') && (pcVar4[-1] != '\\')) {
              bVar1 = !bVar1;
            }
            else if (bVar1) {
              bVar1 = true;
            }
            else {
              bVar1 = false;
              if ((cVar10 == '\'') && (pcVar4[-1] != '\\')) {
                bVar12 = !bVar12;
                bVar1 = false;
              }
            }
            if (((cVar10 != '(') || (bVar1)) || (bVar12)) {
              if (!bVar1) {
                iVar3 = iVar3 - (uint)(cVar10 == ')');
              }
            }
            else {
              iVar3 = iVar3 + 1;
            }
            cVar10 = pcVar4[1];
            pcVar4 = pcVar4 + 1;
          } while (cVar10 != '\0');
        }
      }
      if (lVar7 < 0x3ff) {
        lVar7 = lVar7 + 1;
        *pcVar11 = *pcVar4;
      }
      iVar5 = iVar5 + 1;
      pcVar11 = local_438 + lVar7;
      cVar10 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
    } while (cVar10 != '\0');
  }
  *pcVar11 = '\0';
  if (!bVar2) {
    write_c("%s::%s {\n",pcVar9,local_438);
  }
LAB_001796e8:
  if ((this->havewidgets != '\0') && (l->name_ == (char *)0x0)) {
    pcVar11 = subclassname(l);
    write_c("  %s* w;\n",pcVar11);
  }
  indentation = indentation + 2;
  return;
}

Assistant:

void Fl_Function_Type::write_code1() {
  constructor=0;
  havewidgets = 0;
  Fl_Type *child;
  // if the function has no children (hence no body), Fluid will not generate
  // the function either. This is great if you decide to implement that function
  // inside another module
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_widget()) {
      havewidgets = 1;
      break;
    }
  }
  if (havechildren)
    write_c("\n");
  if (ismain()) {
    if (havechildren)
      write_c("int main(int argc, char **argv) {\n");
  } else {
    const char* rtype = return_type;
    const char* star = "";
    // from matt: let the user type "static " at the start of type
    // in order to declare a static method;
    int is_static = 0;
    int is_virtual = 0;
    if (rtype) {
      if (!strcmp(rtype,"static")) {is_static = 1; rtype = 0;}
      else if (!strncmp(rtype, "static ",7)) {is_static = 1; rtype += 7;}
      if (!strcmp(rtype, "virtual")) {is_virtual = 1; rtype = 0;}
      else if (!strncmp(rtype, "virtual ",8)) {is_virtual = 1; rtype += 8;}
    }
    if (!rtype) {
      if (havewidgets) {
        rtype = subclassname(child);
        star = "*";
      } else rtype = "void";
    }
    
    const char* k = class_name(0);
    if (k) {
      if (havechildren)
        write_comment_c();
      write_public(public_);
      if (name()[0] == '~')
        constructor = 1;
      else {
        size_t n = strlen(k);
        if (!strncmp(name(), k, n) && name()[n] == '(') constructor = 1;
      }
      write_h("  ");
      if (is_static) write_h("static ");
      if (is_virtual) write_h("virtual ");
      if (!constructor) {
        write_h("%s%s ", rtype, star);
        if (havechildren)
          write_c("%s%s ", rtype, star);
      }
      
      // if this is a subclass, only write_h() the part before the ':'
      char s[1024], *sptr = s;
      char *nptr = (char *)name();
      
      while (*nptr) {
        if (*nptr == ':') {
          if (nptr[1] != ':') break;
          // Copy extra ":" for "class::member"...
          *sptr++ = *nptr++;
        }	  
        *sptr++ = *nptr++;
      }
      *sptr = '\0';
      
      write_h("%s;\n", s);
      // skip all function default param. init in body:
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s::%s {\n", k, s);
    } else {
      if (havechildren)
        write_comment_c();
      if (public_) {
        if (cdecl_)
          write_h("extern \"C\" { %s%s %s; }\n", rtype, star, name());
        else
          write_h("%s%s %s;\n", rtype, star, name());
      } else {
        if (havechildren)
          write_c("static ");
      }
      
      // write everything but the default parameters (if any)
      char s[1024], *sptr;
      char *nptr;
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s%s %s {\n", rtype, star, s);
    }
  }
  
  if (havewidgets && !child->name()) write_c("  %s* w;\n", subclassname(child));
  indentation += 2;
}